

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

void __thiscall
HighsHashTree<int,_HighsImplications::VarBound>::InnerLeaf<4>::rehash
          (InnerLeaf<4> *this,int hashPos)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  undefined4 uVar5;
  uint8_t pos_00;
  uint16_t uVar6;
  reference pvVar7;
  uint64_t hash_00;
  reference pvVar8;
  int in_ESI;
  Occupation *in_RDI;
  type entry;
  uint64_t hash;
  int pos;
  uint8_t hashChunk;
  int i;
  int i_1;
  undefined7 in_stack_ffffffffffffff78;
  uint8_t in_stack_ffffffffffffff7f;
  array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_54UL> *in_stack_ffffffffffffff80;
  array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_54UL> *this_00;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 uVar9;
  reference in_stack_ffffffffffffff98;
  InnerLeaf<4> *in_stack_ffffffffffffffa0;
  int local_28;
  int local_20;
  int local_1c;
  Occupation local_18;
  int local_c;
  
  local_c = in_ESI;
  Occupation::Occupation(&local_18,0);
  in_RDI->occupation = local_18.occupation;
  for (local_1c = 0; local_1c < (int)in_RDI[1].occupation; local_1c = local_1c + 1) {
    pvVar7 = std::array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_54UL>::operator[]
                       (in_stack_ffffffffffffff80,
                        CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    HighsHashTableEntry<int,_HighsImplications::VarBound>::key(pvVar7);
    hash_00 = compute_hash((int *)0x5fce6b);
    uVar6 = get_hash_chunks16(hash_00,local_c);
    pvVar8 = std::array<unsigned_long,_55UL>::operator[]
                       ((array<unsigned_long,_55UL> *)in_stack_ffffffffffffff80,
                        CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    *pvVar8 = (ulong)uVar6;
    pvVar8 = std::array<unsigned_long,_55UL>::operator[]
                       ((array<unsigned_long,_55UL> *)in_stack_ffffffffffffff80,
                        CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    pos_00 = get_first_chunk16((uint16_t)*pvVar8);
    Occupation::set(in_RDI,pos_00);
  }
  local_20 = 0;
  while (local_20 < (int)in_RDI[1].occupation) {
    pvVar8 = std::array<unsigned_long,_55UL>::operator[]
                       ((array<unsigned_long,_55UL> *)in_stack_ffffffffffffff80,
                        CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    get_first_chunk16((uint16_t)*pvVar8);
    local_28 = Occupation::num_set_until
                         ((Occupation *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
    local_28 = local_28 + -1;
    this_00 = in_stack_ffffffffffffff80;
    if (local_20 < local_28) {
      in_stack_ffffffffffffff98 =
           std::array<unsigned_long,_55UL>::operator[]
                     ((array<unsigned_long,_55UL> *)in_stack_ffffffffffffff80,
                      CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      pvVar8 = std::array<unsigned_long,_55UL>::operator[]
                         ((array<unsigned_long,_55UL> *)in_stack_ffffffffffffff80,
                          CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      std::swap<unsigned_long>(in_stack_ffffffffffffff98,pvVar8);
      in_stack_ffffffffffffffa0 =
           (InnerLeaf<4> *)
           std::array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_54UL>::operator[]
                     (in_stack_ffffffffffffff80,
                      CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      pvVar7 = std::array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_54UL>::operator[]
                         (in_stack_ffffffffffffff80,
                          CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      std::swap<HighsHashTableEntry<int,HighsImplications::VarBound>>
                ((HighsHashTableEntry<int,_HighsImplications::VarBound> *)in_stack_ffffffffffffffa0,
                 pvVar7);
    }
    else {
      while( true ) {
        uVar9 = false;
        if (local_28 < local_20) {
          pvVar8 = std::array<unsigned_long,_55UL>::operator[]
                             ((array<unsigned_long,_55UL> *)this_00,
                              CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
          uVar1 = *pvVar8;
          pvVar8 = std::array<unsigned_long,_55UL>::operator[]
                             ((array<unsigned_long,_55UL> *)this_00,
                              CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
          uVar9 = *pvVar8 <= uVar1;
        }
        if ((bool)uVar9 == false) break;
        local_28 = local_28 + 1;
      }
      in_stack_ffffffffffffff80 = this_00;
      if (local_28 < local_20) {
        pvVar8 = std::array<unsigned_long,_55UL>::operator[]
                           ((array<unsigned_long,_55UL> *)this_00,
                            CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
        in_stack_ffffffffffffff80 =
             (array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_54UL> *)*pvVar8;
        pvVar7 = std::array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_54UL>::operator[]
                           (this_00,CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
        iVar4 = pvVar7->key_;
        uVar5 = *(undefined4 *)&pvVar7->field_0x4;
        dVar2 = (pvVar7->value_).coef;
        dVar3 = (pvVar7->value_).constant;
        move_backward(in_stack_ffffffffffffffa0,(int *)in_stack_ffffffffffffff98,
                      (int *)CONCAT17(uVar9,in_stack_ffffffffffffff90));
        pvVar8 = std::array<unsigned_long,_55UL>::operator[]
                           ((array<unsigned_long,_55UL> *)in_stack_ffffffffffffff80,
                            CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
        *pvVar8 = (value_type_conflict6)in_stack_ffffffffffffff80;
        pvVar7 = std::array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_54UL>::operator[]
                           (in_stack_ffffffffffffff80,
                            CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
        pvVar7->key_ = iVar4;
        *(undefined4 *)&pvVar7->field_0x4 = uVar5;
        (pvVar7->value_).coef = dVar2;
        (pvVar7->value_).constant = dVar3;
      }
      local_20 = local_20 + 1;
    }
  }
  return;
}

Assistant:

void rehash(int hashPos) {
      // function needs to possibly reorder elements by a different hash value
      // chances are very high we are already ordered correctly as we use 16
      // bits of the hash and one level is uses 6 bits, so the new values
      // are guaranteed to be ordered correctly by their 10 most significant
      // bits if increasing the hash position by 1 and only if the 10 bits of
      // the hash had a collision the new 6 bits might break a tie differently.
      // It is, however, important to maintain the exact ordering as otherwise
      // elements may not be found.
      occupation = 0;
      for (int i = 0; i < size; ++i) {
        hashes[i] = get_hash_chunks16(compute_hash(entries[i].key()), hashPos);
        occupation.set(get_first_chunk16(hashes[i]));
      }

      int i = 0;
      while (i < size) {
        uint8_t hashChunk = get_first_chunk16(hashes[i]);
        int pos = occupation.num_set_until(hashChunk) - 1;

        // if the position is after i the element definitely comes later, so we
        // swap it to that position and proceed without increasing i until
        // eventually an element appears that comes at position i or before
        if (pos > i) {
          std::swap(hashes[pos], hashes[i]);
          std::swap(entries[pos], entries[i]);
          continue;
        }

        // the position is before or at i, now check where the exact location
        // should be for the ordering by hash so that the invariant is that all
        // elements up to i are properly sorted. Essentially insertion sort but
        // with the modification of having a high chance to guess the correct
        // position already using the occupation flags.
        while (pos < i && hashes[pos] >= hashes[i]) ++pos;

        // if the final position is before i we need to move elements to
        // make space at that position, otherwise nothing needs to be done but
        // incrementing i increasing the sorted range by 1.
        if (pos < i) {
          uint64_t hash = hashes[i];
          auto entry = std::move(entries[i]);
          move_backward(pos, i);
          hashes[pos] = hash;
          entries[pos] = std::move(entry);
        }
        ++i;
      }
    }